

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::ReceiveResponseNode
          (EthBasePort *this,nodeid_t node,quadlet_t *rdata,uint nbytes,uint8_t fw_tl,
          nodeid_t *src_node)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  void *this_00;
  uchar *packet_00;
  quadlet_t *packet_data;
  uchar *packetFw;
  uchar boardId;
  int nRecv;
  uchar *rdata_base;
  uchar *puStack_40;
  uint packetSize;
  uchar *packet;
  nodeid_t *src_node_local;
  uint8_t fw_tl_local;
  uint nbytes_local;
  quadlet_t *rdata_local;
  nodeid_t node_local;
  EthBasePort *this_local;
  
  puStack_40 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x18])();
  puStack_40 = puStack_40 + uVar3;
  iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  iVar5 = (*(this->super_BasePort)._vptr_BasePort[0x16])();
  uVar3 = iVar4 + nbytes + iVar5;
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x18])();
  uVar7 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
  if ((uchar *)((long)rdata + (-(ulong)uVar7 - (ulong)uVar6)) ==
      (this->super_BasePort).ReadBufferBroadcast) {
    puStack_40 = (this->super_BasePort).ReadBufferBroadcast;
  }
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puStack_40,(ulong)uVar3);
  if (uVar6 == uVar3) {
    ProcessExtraData(this,puStack_40 + ((ulong)uVar3 - 8));
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x32])(this,puStack_40,0);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
      packet_00 = puStack_40 + uVar3;
      ByteswapQuadlets(this,packet_00,0x14);
      bVar2 = CheckFirewirePacket(this,packet_00,(ulong)nbytes,node,7,(uint)fw_tl);
      if (bVar2) {
        if (src_node != (nodeid_t *)0x0) {
          GetFirewireHeaderInfo(packet_00,src_node,(uint *)0x0,(uint *)0x0);
        }
        uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,4);
        if (rdata != (quadlet_t *)(puStack_40 + uVar3)) {
          (this->super_BasePort).rtRead = false;
          memcpy(rdata,puStack_40 + uVar3,(ulong)nbytes);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    std::operator<<((this->super_BasePort).outStr,"ReadBlock: failed to receive read response");
    bVar1 = (this->super_BasePort).Node2Board[node];
    if (bVar1 < 0x10) {
      poVar8 = std::operator<<((this->super_BasePort).outStr," from board ");
      std::ostream::operator<<(poVar8,(uint)bVar1);
    }
    poVar8 = std::operator<<((this->super_BasePort).outStr,": return value = ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
    poVar8 = std::operator<<(poVar8,", expected = ");
    this_00 = (void *)std::ostream::operator<<(poVar8,uVar3);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::ReceiveResponseNode(nodeid_t node, quadlet_t *rdata,
                                      unsigned int nbytes, uint8_t fw_tl, nodeid_t *src_node)
{
    // Packet to receive
    unsigned char *packet = GenericBuffer+GetReadQuadAlign();;
    unsigned int packetSize = GetPrefixOffset(RD_FW_BDATA) + nbytes + GetReadPostfixSize();

    // Check for real-time read
    unsigned char *rdata_base = reinterpret_cast<unsigned char *>(rdata)-GetReadQuadAlign()-GetPrefixOffset(RD_FW_BDATA);
    if (rdata_base == ReadBufferBroadcast) {
        packet = ReadBufferBroadcast;
    }

    int nRecv = PacketReceive(packet, packetSize);
    if (nRecv != static_cast<int>(packetSize)) {
        outStr << "ReadBlock: failed to receive read response";
        unsigned char boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS)
            outStr << " from board " << static_cast<unsigned int>(boardId);
        outStr << ": return value = " << nRecv
               << ", expected = " << packetSize << std::endl;
        return false;
    }

    ProcessExtraData(packet+packetSize-FW_EXTRA_SIZE);

    if (!CheckEthernetHeader(packet, false))
        return false;
    // Byteswap Firewire header
    unsigned char *packetFw = packet + GetPrefixOffset(RD_FW_HEADER);
    ByteswapQuadlets(packetFw, FW_BRESPONSE_HEADER_SIZE);
    if (!CheckFirewirePacket(packetFw, nbytes, node, EthBasePort::BRESPONSE, fw_tl))
        return false;
    if (src_node)
        GetFirewireHeaderInfo(packetFw, src_node, 0, 0);

    const quadlet_t *packet_data = reinterpret_cast<const quadlet_t *>(packet+GetPrefixOffset(RD_FW_BDATA));
    if (rdata != packet_data) {
        rtRead = false;
        memcpy(rdata, packet_data, nbytes);
    }
    return true;
}